

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

Result __thiscall spectest::JSONParser::ParseTypeVector(JSONParser *this,TypeVector *out_types)

{
  pointer *ppTVar1;
  pointer pTVar2;
  iterator __position;
  bool bVar3;
  Result RVar4;
  Type in_RAX;
  Enum EVar5;
  Type type;
  Type local_38;
  
  pTVar2 = (out_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((out_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_finish != pTVar2) {
    (out_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
    super__Vector_impl_data._M_finish = pTVar2;
  }
  local_38 = in_RAX;
  RVar4 = Expect(this,"[");
  EVar5 = Error;
  if (RVar4.enum_ != Error) {
    bVar3 = Match(this,"]");
    if (bVar3) {
LAB_00121a12:
      EVar5 = Ok;
    }
    else {
      do {
        RVar4 = ParseTypeObject(this,&local_38);
        if (RVar4.enum_ == Error) {
          return (Result)Error;
        }
        __position._M_current =
             (out_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (out_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_realloc_insert<wabt::Type_const&>
                    ((vector<wabt::Type,std::allocator<wabt::Type>> *)out_types,__position,&local_38
                    );
        }
        else {
          *__position._M_current = local_38;
          ppTVar1 = &(out_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppTVar1 = *ppTVar1 + 1;
        }
        bVar3 = Match(this,"]");
        if (bVar3) goto LAB_00121a12;
        RVar4 = Expect(this,",");
      } while (RVar4.enum_ != Error);
    }
  }
  return (Result)EVar5;
}

Assistant:

wabt::Result JSONParser::ParseTypeVector(TypeVector* out_types) {
  out_types->clear();
  EXPECT("[");
  bool first = true;
  while (!Match("]")) {
    if (!first) {
      EXPECT(",");
    }
    Type type;
    CHECK_RESULT(ParseTypeObject(&type));
    first = false;
    out_types->push_back(type);
  }
  return wabt::Result::Ok;
}